

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O3

bool __thiscall cmSourceFile::GetIsGenerated(cmSourceFile *this,CheckScope checkScope)

{
  bool bVar1;
  
  bVar1 = true;
  if (this->IsGenerated == false) {
    if (checkScope == GlobalAndLocal) {
      bVar1 = GetPropertyAsBool(this,&propGENERATED_abi_cxx11_);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmSourceFile::GetIsGenerated(CheckScope checkScope) const
{
  if (this->IsGenerated) {
    // Globally marked as generated!
    return true;
  }
  if (checkScope == CheckScope::GlobalAndLocal) {
    // Check locally stored properties.
    return this->GetPropertyAsBool(propGENERATED);
  }
  return false;
}